

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O3

int nn_port_resolve(char *port,size_t portlen)

{
  size_t sVar1;
  int iVar2;
  
  if (portlen != 0) {
    sVar1 = 0;
    iVar2 = 0;
    do {
      if ((byte)(port[sVar1] - 0x3aU) < 0xf6) {
        return -0x16;
      }
      iVar2 = (uint)(byte)(port[sVar1] - 0x30) + iVar2 * 10;
      if (0xffff < iVar2) {
        return -0x16;
      }
      sVar1 = sVar1 + 1;
    } while (portlen != sVar1);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return -0x16;
}

Assistant:

int nn_port_resolve (const char *port, size_t portlen)
{
    int res;
    size_t i;

    res = 0;
    for (i = 0; i != portlen; ++i) {
        if (port [i] < '0' || port [i] > '9')
            return -EINVAL;
        res *= 10;
        res += port [i] - '0';
        if (res > 0xffff)
            return -EINVAL;
    }

    /*  Port 0 has special meaning (assign an ephemeral port to the socket),
        thus it is illegal to use it in the connection string. */
    if (res == 0)
        return -EINVAL;

    return res;
}